

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O2

void test_clear_clipping(void)

{
  int iVar1;
  ulong uVar2;
  undefined1 *puVar3;
  Am_Style aAStack_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  
  puts("Testing clip-regions with Clear_Area():");
  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&black,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xf8))(d1,10,10,0x118,0xb4);
  clear_whole_window(d1);
  (**(code **)(*(long *)d1 + 0xa0))();
  puts("  Hit RETURN 6 times to nest Am_Drawonable clipping,");
  printf("      while alternately drawing big rectangles and clearing:  ");
  Am_Style::Am_Style(local_40,(Am_Style *)&red);
  Am_Style::Am_Style(local_48,(Am_Style *)&red);
  Am_Style::Am_Style(local_50,(Am_Style *)&blue);
  Am_Style::Am_Style(local_58,(Am_Style *)&blue);
  Am_Style::Am_Style(local_60,(Am_Style *)&red);
  Am_Style::Am_Style(aAStack_68,(Am_Style *)&red);
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  set_style_array(local_40,local_48,local_50,local_58,local_60,aAStack_68,local_30,local_38);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_30);
  Am_Style::~Am_Style(aAStack_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  iVar1 = 0x122;
  puVar3 = style_array;
  for (uVar2 = 0; uVar2 != 6; uVar2 = uVar2 + 1) {
    getchar();
    printf("%d  ",(ulong)((int)uVar2 + 1));
    (**(code **)(*(long *)d1 + 0x108))(d1,0,0,iVar1,iVar1 + -100);
    if ((uVar2 & 1) == 0) {
      (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,puVar3,0,0,300,200,0);
    }
    else {
      clear_whole_window(d1);
    }
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar1 = iVar1 + -0x14;
    puVar3 = puVar3 + 8;
  }
  putchar(10);
  return;
}

Assistant:

void
test_clear_clipping()
{
  printf("Testing clip-regions with Clear_Area():\n");

  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();

  d1->Clear_Clip();
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Set_Clip(10, 10, 280, 180);
  clear_whole_window(d1);
  ;
  d1->Flush_Output();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping,\n");
  printf("      while alternately drawing big rectangles and clearing:  ");
  set_style_array(red, red, blue, blue, red, red);

  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(0, 0, 290 - 20 * counter, 190 - 20 * counter);
    if (counter % 2)
      clear_whole_window(d1);
    else
      d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}